

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

int parse_grammar(Grammar *g,char *pathname,char *sarg)

{
  uint uVar1;
  char *pcVar2;
  D_Parser *ap;
  size_t sVar3;
  D_ParseNode *pDVar4;
  char *local_40;
  char *s;
  int res;
  D_Parser_conflict *p;
  char *sarg_local;
  char *pathname_local;
  Grammar *g_local;
  
  s._4_4_ = 0;
  if ((g->all_pathnames).v == (char **)0x0) {
    pcVar2 = dup_str(pathname,(char *)0x0);
    (g->all_pathnames).v = (g->all_pathnames).e;
    uVar1 = (g->all_pathnames).n;
    (g->all_pathnames).n = uVar1 + 1;
    (g->all_pathnames).e[uVar1] = pcVar2;
  }
  else {
    if ((g->all_pathnames).v == (g->all_pathnames).e) {
      if ((g->all_pathnames).n < 3) {
        pcVar2 = dup_str(pathname,(char *)0x0);
        uVar1 = (g->all_pathnames).n;
        (g->all_pathnames).n = uVar1 + 1;
        (g->all_pathnames).v[uVar1] = pcVar2;
        goto LAB_0014316d;
      }
    }
    else if (((g->all_pathnames).n & 7) != 0) {
      pcVar2 = dup_str(pathname,(char *)0x0);
      uVar1 = (g->all_pathnames).n;
      (g->all_pathnames).n = uVar1 + 1;
      (g->all_pathnames).v[uVar1] = pcVar2;
      goto LAB_0014316d;
    }
    pcVar2 = dup_str(pathname,(char *)0x0);
    vec_add_internal(&g->all_pathnames,pcVar2);
  }
LAB_0014316d:
  local_40 = sarg;
  if ((sarg == (char *)0x0) && (local_40 = sbuf_read(pathname), local_40 == (char *)0x0)) {
    g_local._4_4_ = -1;
  }
  else {
    if ((g->productions).n == 0) {
      initialize_productions(g);
    }
    ap = new_D_Parser((D_ParserTables *)&parser_tables_dparser_gram,0x20);
    ap->initial_globals = g;
    (ap->loc).pathname = pathname;
    sVar3 = strlen(local_40);
    pDVar4 = dparse(ap,local_40,(int)sVar3);
    if (pDVar4 == (D_ParseNode *)0x0) {
      s._4_4_ = -1;
    }
    else if (1 < (g->productions).n) {
      finish_productions(g);
    }
    if (sarg == (char *)0x0) {
      free(local_40);
    }
    free_D_Parser(ap);
    g_local._4_4_ = s._4_4_;
  }
  return g_local._4_4_;
}

Assistant:

int parse_grammar(Grammar *g, char *pathname, char *sarg) {
  D_Parser *p;
  int res = 0;
  char *s = sarg;

  vec_add(&g->all_pathnames, dup_str(pathname, 0));
  if (!s)
    if (!(s = sbuf_read(pathname))) return -1;
  if (!g->productions.n) initialize_productions(g);
  p = new_D_Parser(&parser_tables_dparser_gram, sizeof(D_ParseNode_User));
  p->initial_globals = g;
  p->loc.pathname = pathname;
  if (dparse(p, s, strlen(s))) {
    if (g->productions.n > 1) finish_productions(g);
  } else
    res = -1;
  if (!sarg) FREE(s);
  free_D_Parser(p);
  return res;
}